

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

put_transaction<void> * __thiscall
density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
put_transaction<void>::operator=(put_transaction<void> *this,put_transaction<int> *i_source)

{
  bool bVar1;
  put_transaction<int> *i_source_local;
  put_transaction<void> *this_local;
  
  if ((put_transaction<int> *)this != i_source) {
    bVar1 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            put_transaction<void>::empty((put_transaction<void> *)this);
    if (!bVar1) {
      heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
      put_transaction<void>::cancel((put_transaction<void> *)this);
    }
    std::
    swap<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>*>
              ((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> **)
               this,&i_source->m_queue);
    std::
    swap<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::Allocation>
              ((Allocation *)(this + 8),&i_source->m_put_data);
  }
  return (put_transaction<void> *)this;
}

Assistant:

put_transaction & operator=(put_transaction<OTHERTYPE> && i_source) noexcept
            {
                if (
                  this !=
                  static_cast<void *>(
                    &i_source)) // cast to void to allow comparing pointers to unrelated types
                {
                    if (!empty())
                        cancel();

                    std::swap(m_queue, i_source.m_queue);
                    std::swap(m_put_data, i_source.m_put_data);
                }
                return *this;
            }